

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestSuite::Skip(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *pUVar2;
  TestInfo *this_00;
  int i;
  int i_00;
  
  if (this->should_run_ == true) {
    pUVar2 = internal::GetUnitTestImpl();
    pUVar2->current_test_suite_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
    for (i_00 = 0;
        i_00 < (int)((ulong)((long)(this->test_info_list_).
                                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->test_info_list_).
                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1)
    {
      this_00 = GetMutableTestInfo(this,i_00);
      TestInfo::Skip(this_00);
    }
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1,this);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
    pUVar2->current_test_suite_ = (TestSuite *)0x0;
  }
  return;
}

Assistant:

void TestSuite::Skip() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI

  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Skip();
  }

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
  // Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI

  impl->set_current_test_suite(nullptr);
}